

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O1

int ffcpfl(fitsfile *infptr,fitsfile *outfptr,int previous,int current,int following,int *status)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int hdunum;
  undefined8 uStack_38;
  
  uVar1 = *status;
  uStack_38 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  if (infptr == outfptr) {
    *status = 0x65;
    iVar3 = 0x65;
  }
  else {
    ffghdn(infptr,(int *)((long)&uStack_38 + 4));
    if ((previous != 0) && (1 < uStack_38._4_4_)) {
      iVar3 = 1;
      do {
        ffmahd(infptr,iVar3,(int *)0x0,status);
        ffcopy(infptr,outfptr,0,status);
        iVar3 = iVar3 + 1;
      } while (iVar3 < uStack_38._4_4_);
    }
    if ((current != 0) && (*status < 1)) {
      ffmahd(infptr,uStack_38._4_4_,(int *)0x0,status);
      ffcopy(infptr,outfptr,0,status);
    }
    if ((following != 0) && (*status < 1)) {
      iVar3 = uStack_38._4_4_;
      do {
        iVar3 = iVar3 + 1;
        iVar2 = ffmahd(infptr,iVar3,(int *)0x0,status);
        if (iVar2 != 0) {
          if (*status == 0x6b) {
            *status = 0;
          }
          break;
        }
        iVar2 = ffcopy(infptr,outfptr,0,status);
      } while (iVar2 == 0);
    }
    ffmahd(infptr,uStack_38._4_4_,(int *)0x0,status);
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffcpfl(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int previous,        /* I - copy any previous HDUs?   */
           int current,         /* I - copy the current HDU?     */
           int following,       /* I - copy any following HDUs?   */
           int *status)         /* IO - error status     */
/*
  copy all or part of the input file to the output file.
*/
{
    int hdunum, ii;

    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    ffghdn(infptr, &hdunum);

    if (previous) {   /* copy any previous HDUs */
        for (ii=1; ii < hdunum; ii++) {
            ffmahd(infptr, ii, NULL, status);
            ffcopy(infptr, outfptr, 0, status);
        }
    }

    if (current && (*status <= 0) ) {  /* copy current HDU */
        ffmahd(infptr, hdunum, NULL, status);
        ffcopy(infptr, outfptr, 0, status);
    }

    if (following && (*status <= 0) ) { /* copy any remaining HDUs */
        ii = hdunum + 1;
        while (1)
        { 
            if (ffmahd(infptr, ii, NULL, status) ) {
                 /* reset expected end of file status */
                 if (*status == END_OF_FILE)
                    *status = 0;
                 break;
            }

            if (ffcopy(infptr, outfptr, 0, status))
                 break;  /* quit on unexpected error */

            ii++;
        }
    }

    ffmahd(infptr, hdunum, NULL, status);  /* restore initial position */
    return(*status);
}